

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_chart_add_slot_colored
               (nk_context *ctx,nk_chart_type type,nk_color color,nk_color highlight,int count,
               float min_value,float max_value)

{
  int iVar1;
  nk_panel *pnVar2;
  long lVar3;
  float fVar4;
  
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (pnVar2 = ctx->current->layout, pnVar2 != (nk_panel *)0x0)) {
    iVar1 = (pnVar2->chart).slot;
    lVar3 = (long)iVar1;
    if (lVar3 < 4) {
      (pnVar2->chart).slot = iVar1 + 1;
      (pnVar2->chart).slots[lVar3].type = type;
      (pnVar2->chart).slots[lVar3].count = count;
      (pnVar2->chart).slots[lVar3].color = color;
      (pnVar2->chart).slots[lVar3].highlight = highlight;
      fVar4 = min_value;
      if (max_value <= min_value) {
        fVar4 = max_value;
      }
      (pnVar2->chart).slots[lVar3].min = fVar4;
      if (max_value <= min_value) {
        max_value = min_value;
      }
      (pnVar2->chart).slots[lVar3].max = max_value;
      (pnVar2->chart).slots[lVar3].range = max_value - fVar4;
    }
  }
  return;
}

Assistant:

NK_API void
nk_chart_add_slot_colored(struct nk_context *ctx, const enum nk_chart_type type,
struct nk_color color, struct nk_color highlight,
int count, float min_value, float max_value)
{
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
NK_ASSERT(ctx->current->layout->chart.slot < NK_CHART_MAX_SLOT);
if (!ctx || !ctx->current || !ctx->current->layout) return;
if (ctx->current->layout->chart.slot >= NK_CHART_MAX_SLOT) return;

/* add another slot into the graph */
{struct nk_chart *chart = &ctx->current->layout->chart;
struct nk_chart_slot *slot = &chart->slots[chart->slot++];
slot->type = type;
slot->count = count;
slot->color = color;
slot->highlight = highlight;
slot->min = NK_MIN(min_value, max_value);
slot->max = NK_MAX(min_value, max_value);
slot->range = slot->max - slot->min;}
}